

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitArrayNewData(BinaryInstWriter *this,ArrayNewData *curr)

{
  WasmBinaryWriter *this_00;
  BufferWithRandomAccess *this_01;
  U32LEB x;
  HeapType type;
  
  BufferWithRandomAccess::operator<<(this->o,-5);
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x9);
  this_00 = this->parent;
  type = wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)71>).super_Expression.
                     type);
  WasmBinaryWriter::writeIndexedHeapType(this_00,type);
  this_01 = this->o;
  x.value = WasmBinaryWriter::getDataSegmentIndex
                      (this->parent,(Name)(curr->segment).super_IString.str);
  BufferWithRandomAccess::operator<<(this_01,x);
  return;
}

Assistant:

void BinaryInstWriter::visitArrayNewData(ArrayNewData* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  o << U32LEB(BinaryConsts::ArrayNewData);
  parent.writeIndexedHeapType(curr->type.getHeapType());
  o << U32LEB(parent.getDataSegmentIndex(curr->segment));
}